

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::SetBit
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  uint *puVar1;
  uint32 uVar2;
  uint32 uVar3;
  LogMessage *pLVar4;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (*(char *)(*(long *)(field + 0x80) + 0x6f) == '\x01') {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x7eb);
    pLVar4 = LogMessage::operator<<(&local_60,"CHECK failed: !field->options().weak(): ");
    LogFinisher::operator=(&local_61,pLVar4);
    LogMessage::~LogMessage(&local_60);
  }
  if ((this->schema_).has_bits_offset_ != -1) {
    uVar2 = ReflectionSchema::HasBitIndex(&this->schema_,field);
    if ((this->schema_).has_bits_offset_ == -1) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x77c);
      pLVar4 = LogMessage::operator<<(&local_60,"CHECK failed: schema_.HasHasbits(): ");
      LogFinisher::operator=(&local_61,pLVar4);
      LogMessage::~LogMessage(&local_60);
    }
    uVar3 = ReflectionSchema::HasBitsOffset(&this->schema_);
    puVar1 = (uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                     (ulong)(uVar2 >> 5) * 4 + (ulong)uVar3);
    *puVar1 = *puVar1 | 1 << ((byte)uVar2 & 0x1f);
  }
  return;
}

Assistant:

inline void GeneratedMessageReflection::SetBit(
    Message* message, const FieldDescriptor* field) const {
  GOOGLE_DCHECK(!field->options().weak());
  if (!schema_.HasHasbits()) {
    return;
  }
  const uint32 index = schema_.HasBitIndex(field);
  MutableHasBits(message)[index / 32] |=
      (static_cast<uint32>(1) << (index % 32));
}